

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_bitsel_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b,TCGv_i64 c)

{
  TCGv_i64 ret;
  uintptr_t o;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_and_i64_tricore(tcg_ctx,ret,b,a);
  tcg_gen_andc_i64_tricore(tcg_ctx,d,c,a);
  tcg_gen_or_i64_tricore(tcg_ctx,d,d,ret);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void tcg_gen_bitsel_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b, TCGv_i64 c)
{
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_and_i64(tcg_ctx, t, b, a);
    tcg_gen_andc_i64(tcg_ctx, d, c, a);
    tcg_gen_or_i64(tcg_ctx, d, d, t);
    tcg_temp_free_i64(tcg_ctx, t);
}